

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioVoice_SetOutputVoices(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  FAudioVoiceSends *pFVar1;
  uint uVar2;
  long lVar3;
  uint32_t uVar4;
  FAudio *pFVar5;
  FAudioSendDescriptor *pFVar6;
  float **ppfVar7;
  FAudioMixCallback *pp_Var8;
  float *pfVar9;
  FAudioFilterParameters *pFVar10;
  FAudioFilterState **ppafVar11;
  FAudioFilterState *pafVar12;
  undefined **ppuVar13;
  uint32_t uVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  FAudioSendDescriptor **ppFVar18;
  FAudioVoiceSends local_4c;
  FAudioSendDescriptor defaultSend;
  
  uVar14 = 0x88960001;
  if (voice->type == FAUDIO_VOICE_MASTER) {
    return 0x88960001;
  }
  FAudio_PlatformLockMutex(voice->sendLock);
  uVar4 = FAudio_INTERNAL_VoiceOutputFrequency(voice,pSendList);
  if (uVar4 == 0) {
    ppFVar18 = &pSendList->pSends;
    FAudio_PlatformLockMutex(voice->volumeLock);
    pFVar1 = &voice->sends;
    for (uVar15 = 0; uVar15 < pFVar1->SendCount; uVar15 = uVar15 + 1) {
      (*voice->audio->pFree)(voice->sendCoefficients[uVar15]);
    }
    ppfVar7 = voice->sendCoefficients;
    if (ppfVar7 != (float **)0x0) {
      (*voice->audio->pFree)(ppfVar7);
    }
    for (uVar15 = 0; uVar15 < pFVar1->SendCount; uVar15 = uVar15 + 1) {
      (*voice->audio->pFree)(voice->mixCoefficients[uVar15]);
    }
    if (voice->mixCoefficients != (float **)0x0) {
      (*voice->audio->pFree)(voice->mixCoefficients);
    }
    if (voice->sendMix != (FAudioMixCallback *)0x0) {
      (*voice->audio->pFree)(voice->sendMix);
    }
    if (voice->sendFilter != (FAudioFilterParameters *)0x0) {
      (*voice->audio->pFree)(voice->sendFilter);
      voice->sendFilter = (FAudioFilterParameters *)0x0;
    }
    if (voice->sendFilterState != (FAudioFilterState **)0x0) {
      for (uVar15 = 0; uVar15 < pFVar1->SendCount; uVar15 = uVar15 + 1) {
        if (voice->sendFilterState[uVar15] != (FAudioFilterState *)0x0) {
          (*voice->audio->pFree)(voice->sendFilterState[uVar15]);
        }
      }
      (*voice->audio->pFree)(voice->sendFilterState);
      voice->sendFilterState = (FAudioFilterState **)0x0;
    }
    pFVar6 = (voice->sends).pSends;
    if (pFVar6 != (FAudioSendDescriptor *)0x0) {
      (*voice->audio->pFree)(pFVar6);
    }
    if (pSendList == (FAudioVoiceSends *)0x0) {
      defaultSend.Flags = 0;
      pFVar5 = voice->audio;
      defaultSend.pOutputVoice = pFVar5->master;
      pSendList = &local_4c;
      local_4c.SendCount = 1;
      ppFVar18 = &local_4c.pSends;
      local_4c.pSends = &defaultSend;
      uVar14 = 1;
    }
    else {
      uVar14 = pSendList->SendCount;
      if (uVar14 == 0) {
        voice->sendCoefficients = (float **)0x0;
        voice->mixCoefficients = (float **)0x0;
        voice->sendMix = (FAudioMixCallback *)0x0;
        uVar14 = 0;
        SDL_memset(pFVar1,0,0xc);
        FAudio_PlatformUnlockMutex(voice->volumeLock);
        goto LAB_00112fb7;
      }
      pFVar5 = voice->audio;
    }
    (voice->sends).SendCount = uVar14;
    pFVar6 = (FAudioSendDescriptor *)(*pFVar5->pMalloc)((ulong)pSendList->SendCount * 0xc);
    (voice->sends).pSends = pFVar6;
    SDL_memcpy(pFVar6,*ppFVar18,(ulong)pSendList->SendCount * 0xc);
    ppfVar7 = (float **)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
    voice->sendCoefficients = ppfVar7;
    ppfVar7 = (float **)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
    voice->mixCoefficients = ppfVar7;
    pp_Var8 = (FAudioMixCallback *)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
    voice->sendMix = pp_Var8;
    lVar16 = 0;
    for (uVar15 = 0; uVar15 < pSendList->SendCount; uVar15 = uVar15 + 1) {
      lVar3 = *(long *)((long)&(*ppFVar18)->pOutputVoice + lVar16);
      uVar2 = *(uint *)((ulong)(*(int *)(lVar3 + 0xc) != 2) * 0x10 + 0xd8 + lVar3);
      lVar3 = (ulong)uVar2 * 4;
      pfVar9 = (float *)(*voice->audio->pMalloc)((ulong)voice->outputChannels * lVar3);
      voice->sendCoefficients[uVar15] = pfVar9;
      pfVar9 = (float *)(*voice->audio->pMalloc)((ulong)voice->outputChannels * lVar3);
      voice->mixCoefficients[uVar15] = pfVar9;
      SDL_memcpy(voice->sendCoefficients[uVar15],
                 FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1] + (uVar2 - 1),
                 (ulong)(voice->outputChannels * uVar2) << 2);
      FAudio_RecalcMixMatrix(voice,(uint32_t)uVar15);
      if (voice->outputChannels == 2) {
        pp_Var8 = &FAudio_INTERNAL_Mix_Generic;
        if (uVar2 - 1 < 8) {
          if ((0xa3U >> (uVar2 - 1 & 0x1f) & 1) != 0) {
            ppuVar13 = &PTR_FAudio_INTERNAL_Mix_2in_1out_Scalar_0012db00;
            goto LAB_0011328b;
          }
LAB_00113279:
          pp_Var8 = &FAudio_INTERNAL_Mix_Generic;
        }
      }
      else {
        pp_Var8 = &FAudio_INTERNAL_Mix_Generic;
        if (voice->outputChannels == 1) {
          pp_Var8 = &FAudio_INTERNAL_Mix_Generic;
          if (uVar2 - 1 < 8) {
            if ((0xa3U >> (uVar2 - 1 & 0x1f) & 1) == 0) goto LAB_00113279;
            ppuVar13 = &PTR_FAudio_INTERNAL_Mix_1in_1out_Scalar_0012dac0;
LAB_0011328b:
            pp_Var8 = (FAudioMixCallback *)(ppuVar13 + (uVar2 - 1));
          }
        }
      }
      voice->sendMix[uVar15] = *pp_Var8;
      if ((*(byte *)((long)&(*ppFVar18)->Flags + lVar16) & 0x80) != 0) {
        pFVar10 = voice->sendFilter;
        if (pFVar10 == (FAudioFilterParameters *)0x0) {
          pFVar10 = (FAudioFilterParameters *)
                    (*voice->audio->pMalloc)((ulong)pSendList->SendCount * 0xc);
          voice->sendFilter = pFVar10;
        }
        if (voice->sendFilterState == (FAudioFilterState **)0x0) {
          ppafVar11 = (FAudioFilterState **)
                      (*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
          voice->sendFilterState = ppafVar11;
          SDL_memset(ppafVar11,0,(ulong)pSendList->SendCount << 3);
          pFVar10 = voice->sendFilter;
        }
        *(undefined4 *)((long)&pFVar10->Type + lVar16) = 0;
        *(undefined8 *)((long)&pFVar10->Frequency + lVar16) = 0x3f8000003f800000;
        sVar17 = (ulong)uVar2 << 4;
        pafVar12 = (FAudioFilterState *)(*voice->audio->pMalloc)(sVar17);
        voice->sendFilterState[uVar15] = pafVar12;
        SDL_memset(voice->sendFilterState[uVar15],0,sVar17);
      }
      lVar16 = lVar16 + 0xc;
    }
    FAudio_PlatformUnlockMutex(voice->volumeLock);
    FAudio_PlatformUnlockMutex(voice->sendLock);
    uVar14 = 0;
  }
  else {
LAB_00112fb7:
    FAudio_PlatformUnlockMutex(voice->sendLock);
  }
  return uVar14;
}

Assistant:

uint32_t FAudioVoice_SetOutputVoices(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t i;
	uint32_t outChannels;
	FAudioVoiceSends defaultSends;
	FAudioSendDescriptor defaultSend;

	LOG_API_ENTER(voice->audio)

	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	if (FAudio_INTERNAL_VoiceOutputFrequency(voice, pSendList) != 0)
	{
		LOG_ERROR(
			voice->audio,
			"%s",
			"Changing the sample rate while an effect chain is attached is invalid!"
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)

	/* FIXME: This is lazy... */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->sendCoefficients[i]);
	}
	if (voice->sendCoefficients != NULL)
	{
		voice->audio->pFree(voice->sendCoefficients);
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->mixCoefficients[i]);
	}
	if (voice->mixCoefficients != NULL)
	{
		voice->audio->pFree(voice->mixCoefficients);
	}
	if (voice->sendMix != NULL)
	{
		voice->audio->pFree(voice->sendMix);
	}
	if (voice->sendFilter != NULL)
	{
		voice->audio->pFree(voice->sendFilter);
		voice->sendFilter = NULL;
	}
	if (voice->sendFilterState != NULL)
	{
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			if (voice->sendFilterState[i] != NULL)
			{
				voice->audio->pFree(voice->sendFilterState[i]);
			}
		}
		voice->audio->pFree(voice->sendFilterState);
		voice->sendFilterState = NULL;
	}
	if (voice->sends.pSends != NULL)
	{
		voice->audio->pFree(voice->sends.pSends);
	}

	if (pSendList == NULL)
	{
		/* Default to the mastering voice as output */
		defaultSend.Flags = 0;
		defaultSend.pOutputVoice = voice->audio->master;
		defaultSends.SendCount = 1;
		defaultSends.pSends = &defaultSend;
		pSendList = &defaultSends;
	}
	else if (pSendList->SendCount == 0)
	{
		/* No sends? Nothing to do... */
		voice->sendCoefficients = NULL;
		voice->mixCoefficients = NULL;
		voice->sendMix = NULL;
		FAudio_zero(&voice->sends, sizeof(FAudioVoiceSends));

		FAudio_PlatformUnlockMutex(voice->volumeLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Copy send list */
	voice->sends.SendCount = pSendList->SendCount;
	voice->sends.pSends = (FAudioSendDescriptor*) voice->audio->pMalloc(
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);
	FAudio_memcpy(
		voice->sends.pSends,
		pSendList->pSends,
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);

	/* Allocate/Reset default output matrix, mixer function, filters */
	voice->sendCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->mixCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->sendMix = (FAudioMixCallback*) voice->audio->pMalloc(
		sizeof(FAudioMixCallback) * pSendList->SendCount
	);

	for (i = 0; i < pSendList->SendCount; i += 1)
	{
		if (pSendList->pSends[i].pOutputVoice->type == FAUDIO_VOICE_MASTER)
		{
			outChannels = pSendList->pSends[i].pOutputVoice->master.inputChannels;
		}
		else
		{
			outChannels = pSendList->pSends[i].pOutputVoice->mix.inputChannels;
		}
		voice->sendCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);
		voice->mixCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);

		FAudio_assert(voice->outputChannels > 0 && voice->outputChannels < 9);
		FAudio_assert(outChannels > 0 && outChannels < 9);
		FAudio_memcpy(
			voice->sendCoefficients[i],
			FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1][outChannels - 1],
			voice->outputChannels * outChannels * sizeof(float)
		);
		FAudio_RecalcMixMatrix(voice, i);

		if (voice->outputChannels == 1)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
			}
		}
		else if (voice->outputChannels == 2)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
			}
		}
		else
		{
			voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
		}

		if (pSendList->pSends[i].Flags & FAUDIO_SEND_USEFILTER)
		{
			/* Allocate the whole send filter array if needed... */
			if (voice->sendFilter == NULL)
			{
				voice->sendFilter = (FAudioFilterParameters*) voice->audio->pMalloc(
					sizeof(FAudioFilterParameters) * pSendList->SendCount
				);
			}
			if (voice->sendFilterState == NULL)
			{
				voice->sendFilterState = (FAudioFilterState**) voice->audio->pMalloc(
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
				FAudio_zero(
					voice->sendFilterState,
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
			}

			/* ... then fill in this send's filter data */
			voice->sendFilter[i].Type = FAUDIO_DEFAULT_FILTER_TYPE;
			voice->sendFilter[i].Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			voice->sendFilter[i].OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			voice->sendFilterState[i] = (FAudioFilterState*) voice->audio->pMalloc(
				sizeof(FAudioFilterState) * outChannels
			);
			FAudio_zero(
				voice->sendFilterState[i],
				sizeof(FAudioFilterState) * outChannels
			);
		}
	}

	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}